

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> __thiscall
fmt::v8::detail::
write_int_noinline<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          write_int_arg<unsigned_long> arg,basic_format_specs<wchar_t> *specs,locale_ref loc)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  int num_digits_00;
  type tVar3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *pbVar4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar5;
  bool bVar6;
  char local_3bb;
  char local_3b9;
  basic_format_specs<wchar_t> *specs_local;
  locale_ref loc_local;
  write_int_arg<unsigned_long> arg_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  undefined4 uStack_304;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint local_2c4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bStack_2c0;
  uint prefix;
  unsigned_long abs_value;
  basic_format_specs<wchar_t> *local_2b0;
  buffer<wchar_t> *local_2a8;
  uint local_2a0;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_298;
  buffer<wchar_t> *local_290;
  anon_class_40_3_03e05ccd local_288;
  buffer<wchar_t> *local_260;
  undefined1 local_258 [8];
  write_int_data<wchar_t> data;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_230;
  uint local_228;
  uint local_224;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bStack_220;
  uint p;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it;
  anon_class_16_2_2cc2fad2_for_write_digits local_208;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_1f8;
  buffer<wchar_t> *local_1f0;
  anon_class_40_3_03e05ccd_conflict local_1e8;
  buffer<wchar_t> *local_1c0;
  undefined1 local_1b8 [8];
  write_int_data<wchar_t> data_1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_190;
  uint local_188;
  uint local_184;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bStack_180;
  uint p_1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it_1;
  anon_class_16_3_9e397504_for_write_digits local_168;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_158;
  buffer<wchar_t> *local_150;
  anon_class_40_3_03e05ccd local_148;
  buffer<wchar_t> *local_120;
  undefined1 local_118 [8];
  write_int_data<wchar_t> data_2;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_f0;
  uint local_e8;
  uint local_e4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bStack_e0;
  uint p_2;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it_2;
  anon_class_16_2_2cc2fad2_for_write_digits local_c8;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_b8;
  buffer<wchar_t> *local_b0;
  anon_class_40_3_03e05ccd local_a8;
  buffer<wchar_t> *local_80;
  undefined1 local_78 [8];
  write_int_data<wchar_t> data_3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_50;
  uint local_48;
  uint local_44;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bStack_40;
  uint p_3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it_3;
  anon_class_16_2_2cc2fad2_for_write_digits local_28;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_18;
  buffer<wchar_t> *local_10;
  
  abs_value = arg._8_8_;
  local_2c4 = (uint)arg.abs_value;
  bStack_2c0.container = out.container;
  local_2b0 = specs;
  local_2a8 = out.container;
  local_2a0 = local_2c4;
  local_298.container = (buffer<wchar_t> *)this;
  switch(((basic_format_specs<wchar_t> *)abs_value)->type) {
  case none:
  case dec:
    if (((*(ushort *)&((basic_format_specs<wchar_t> *)abs_value)->field_0x9 >> 8 & 1) == 0) ||
       (bVar6 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,wchar_t>
                          (&local_298,(unsigned_long)out.container,local_2c4,
                           (basic_format_specs<wchar_t> *)abs_value,(locale_ref)specs), !bVar6)) {
      local_208.num_digits = count_digits((uint64_t)bStack_2c0.container);
      uVar1 = local_2c4;
      local_1f8.container = local_298.container;
      local_208.abs_value = (unsigned_long)bStack_2c0.container;
      it.container = (buffer<wchar_t> *)abs_value;
      if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
        tVar3 = to_unsigned<int>(local_208.num_digits);
        pbVar4 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                           (&local_1f8,(ulong)(tVar3 + (uVar1 >> 0x18)));
        bStack_220.container = pbVar4->container;
        if (uVar1 != 0) {
          for (local_224 = uVar1 & 0xffffff; local_224 != 0; local_224 = local_224 >> 8) {
            local_228 = local_224 & 0xff;
            local_230 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator++
                                  (&stack0xfffffffffffffde0,0);
            pbVar4 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator*
                               (&local_230);
            std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator=
                      (pbVar4,(value_type_conflict5 *)&local_228);
          }
        }
        bVar2.container = local_1f8.container;
        data.padding = (size_t)bStack_220.container;
        bVar5 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1589:41)>
                ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                          (&local_208,bStack_220.container);
        local_1f0 = (buffer<wchar_t> *)
                    base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                              (bVar2,bVar5);
      }
      else {
        write_int_data<wchar_t>::write_int_data
                  ((write_int_data<wchar_t> *)local_258,local_208.num_digits,local_2c4,
                   (basic_format_specs<wchar_t> *)abs_value);
        local_260 = local_1f8.container;
        local_288.prefix = uVar1;
        local_288.data.size = (size_t)local_258;
        local_288.data.padding = data.size;
        local_288.write_digits.abs_value = local_208.abs_value;
        local_288.write_digits.num_digits = local_208.num_digits;
        local_1f0 = (buffer<wchar_t> *)
                    write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                              (local_1f8,it.container,(size_t)local_258,&local_288);
      }
      local_290 = local_1f0;
    }
    else {
      local_290 = local_298.container;
    }
    break;
  case oct:
    local_28.num_digits = count_digits<3,unsigned_long>((unsigned_long)out.container);
    if ((((*(ushort *)(abs_value + 9) >> 7 & 1) != 0) &&
        (*(int *)(abs_value + 4) <= local_28.num_digits)) &&
       (bStack_2c0.container != (buffer<wchar_t> *)0x0)) {
      prefix_append(&local_2c4,0x30);
    }
    uVar1 = local_2c4;
    local_18.container = local_298.container;
    local_28.abs_value = (unsigned_long)bStack_2c0.container;
    it_3.container = (buffer<wchar_t> *)abs_value;
    if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
      tVar3 = to_unsigned<int>(local_28.num_digits);
      pbVar4 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                         (&local_18,(ulong)(tVar3 + (uVar1 >> 0x18)));
      bStack_40.container = pbVar4->container;
      if (uVar1 != 0) {
        for (local_44 = uVar1 & 0xffffff; local_44 != 0; local_44 = local_44 >> 8) {
          local_48 = local_44 & 0xff;
          local_50 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator++
                               (&stack0xffffffffffffffc0,0);
          pbVar4 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator*
                             (&local_50);
          std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator=
                    (pbVar4,(value_type_conflict5 *)&local_48);
        }
      }
      bVar2.container = local_18.container;
      data_3.padding = (size_t)bStack_40.container;
      bVar5 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1622:22)>
              ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                        (&local_28,bStack_40.container);
      local_10 = (buffer<wchar_t> *)
                 base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                           (bVar2,bVar5);
    }
    else {
      write_int_data<wchar_t>::write_int_data
                ((write_int_data<wchar_t> *)local_78,local_28.num_digits,local_2c4,
                 (basic_format_specs<wchar_t> *)abs_value);
      local_80 = local_18.container;
      local_a8.prefix = uVar1;
      local_a8.data.size = (size_t)local_78;
      local_a8.data.padding = data_3.size;
      local_a8.write_digits.abs_value = local_28.abs_value;
      local_a8.write_digits.num_digits = local_28.num_digits;
      local_10 = (buffer<wchar_t> *)
                 write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           (local_18,it_3.container,(size_t)local_78,&local_a8);
    }
    local_290 = local_10;
    break;
  case hex_lower:
  case hex_upper:
    bVar6 = ((basic_format_specs<wchar_t> *)abs_value)->type == hex_upper;
    if ((*(ushort *)&((basic_format_specs<wchar_t> *)abs_value)->field_0x9 >> 7 & 1) != 0) {
      local_3b9 = 'X';
      if (!bVar6) {
        local_3b9 = 'x';
      }
      prefix_append(&local_2c4,(int)local_3b9 << 8 | 0x30);
    }
    num_digits_00 = count_digits<4,unsigned_long>((unsigned_long)bStack_2c0.container);
    uVar1 = local_2c4;
    uStack_304 = CONCAT31(uStack_304._1_3_,bVar6);
    local_168._12_4_ = uStack_304;
    local_168.num_digits = num_digits_00;
    local_158.container = local_298.container;
    local_168.abs_value = (unsigned_long)bStack_2c0.container;
    it_1.container = (buffer<wchar_t> *)abs_value;
    if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
      tVar3 = to_unsigned<int>(num_digits_00);
      pbVar4 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                         (&local_158,(ulong)(tVar3 + (uVar1 >> 0x18)));
      bStack_180.container = pbVar4->container;
      if (uVar1 != 0) {
        for (local_184 = uVar1 & 0xffffff; local_184 != 0; local_184 = local_184 >> 8) {
          local_188 = local_184 & 0xff;
          local_190 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator++
                                (&stack0xfffffffffffffe80,0);
          pbVar4 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator*
                             (&local_190);
          std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator=
                    (pbVar4,(value_type_conflict5 *)&local_188);
        }
      }
      bVar2.container = local_158.container;
      data_1.padding = (size_t)bStack_180.container;
      bVar5 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1600:41)>
              ::anon_class_40_3_03e05ccd::anon_class_16_3_9e397504_for_write_digits::operator()
                        (&local_168,bStack_180.container);
      local_150 = (buffer<wchar_t> *)
                  base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                            (bVar2,bVar5);
    }
    else {
      write_int_data<wchar_t>::write_int_data
                ((write_int_data<wchar_t> *)local_1b8,num_digits_00,local_2c4,
                 (basic_format_specs<wchar_t> *)abs_value);
      local_1c0 = local_158.container;
      local_1e8.prefix = uVar1;
      local_1e8.data.size = (size_t)local_1b8;
      local_1e8.data.padding = data_1.size;
      local_1e8.write_digits.abs_value = local_168.abs_value;
      local_1e8.write_digits.num_digits = local_168.num_digits;
      local_1e8.write_digits.upper = local_168.upper;
      local_150 = (buffer<wchar_t> *)
                  write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                            (local_158,it_1.container,(size_t)local_1b8,&local_1e8);
    }
    local_290 = local_150;
    break;
  case bin_lower:
  case bin_upper:
    if ((*(ushort *)&((basic_format_specs<wchar_t> *)abs_value)->field_0x9 >> 7 & 1) != 0) {
      local_3bb = 'B';
      if (((basic_format_specs<wchar_t> *)abs_value)->type != bin_upper) {
        local_3bb = 'b';
      }
      prefix_append(&local_2c4,(int)local_3bb << 8 | 0x30);
    }
    local_c8.num_digits = count_digits<1,unsigned_long>((unsigned_long)bStack_2c0.container);
    uVar1 = local_2c4;
    local_b8.container = local_298.container;
    local_c8.abs_value = (unsigned_long)bStack_2c0.container;
    it_2.container = (buffer<wchar_t> *)abs_value;
    if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
      tVar3 = to_unsigned<int>(local_c8.num_digits);
      pbVar4 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                         (&local_b8,(ulong)(tVar3 + (uVar1 >> 0x18)));
      bStack_e0.container = pbVar4->container;
      if (uVar1 != 0) {
        for (local_e4 = uVar1 & 0xffffff; local_e4 != 0; local_e4 = local_e4 >> 8) {
          local_e8 = local_e4 & 0xff;
          local_f0 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator++
                               (&stack0xffffffffffffff20,0);
          pbVar4 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator*
                             (&local_f0);
          std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator=
                    (pbVar4,(value_type_conflict5 *)&local_e8);
        }
      }
      bVar2.container = local_b8.container;
      data_2.padding = (size_t)bStack_e0.container;
      bVar5 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1611:22)>
              ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                        (&local_c8,bStack_e0.container);
      local_b0 = (buffer<wchar_t> *)
                 base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                           (bVar2,bVar5);
    }
    else {
      write_int_data<wchar_t>::write_int_data
                ((write_int_data<wchar_t> *)local_118,local_c8.num_digits,local_2c4,
                 (basic_format_specs<wchar_t> *)abs_value);
      local_120 = local_b8.container;
      local_148.prefix = uVar1;
      local_148.data.size = (size_t)local_118;
      local_148.data.padding = data_2.size;
      local_148.write_digits.abs_value = local_c8.abs_value;
      local_148.write_digits.num_digits = local_c8.num_digits;
      local_b0 = (buffer<wchar_t> *)
                 write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           (local_b8,it_2.container,(size_t)local_118,&local_148);
    }
    local_290 = local_b0;
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
    break;
  case chr:
    local_290 = (buffer<wchar_t> *)
                write_char<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                          ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)this,
                           (wchar_t)out.container,(basic_format_specs<wchar_t> *)abs_value);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_290;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}